

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  short sVar3;
  ushort uVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  stbi__uint32 sVar7;
  stbi_uc *psVar8;
  undefined8 uVar9;
  ulong uVar10;
  bool bVar11;
  undefined4 uVar12;
  stbi__uint32 *psVar13;
  stbi__uint32 *psVar14;
  stbi_uc sVar15;
  byte bVar16;
  char cVar17;
  stbi__uint16 sVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  stbi__jpeg *psVar26;
  stbi__context *data_00;
  long lVar27;
  float *data_01;
  void *pvVar28;
  code *pcVar29;
  stbi__context *psVar30;
  char *pcVar31;
  uchar *data_02;
  stbi__uint16 *data_03;
  byte *pbVar32;
  uchar *puVar33;
  long lVar34;
  stbi_uc *psVar35;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar39;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  undefined1 auVar40 [8];
  ulong uVar41;
  stbi__uint16 *psVar42;
  ulong uVar43;
  stbi_uc *psVar44;
  int iVar45;
  undefined7 uVar46;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  ulong uVar47;
  int iVar48;
  uint uVar49;
  stbi_uc (*pasVar50) [4];
  uint uVar51;
  int iVar52;
  stbi__context *psVar53;
  short *psVar54;
  int *piVar55;
  stbi__uint16 *psVar56;
  long in_FS_OFFSET;
  bool bVar57;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  float fVar69;
  float fVar70;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_register_000014c4 [12];
  undefined1 auVar78 [16];
  stbi_uc *coutput [4];
  short data [64];
  uint local_8a10;
  stbi__uint16 *local_89f8;
  ulong local_89e8;
  int local_89dc;
  stbi__uint16 *local_89d0;
  ulong local_89b8;
  undefined1 local_8988 [8];
  undefined8 uStack_8980;
  undefined8 uStack_8978;
  undefined8 uStack_8970;
  int local_8968;
  stbi__uint32 *local_8958;
  stbi__uint32 *local_8950;
  int *local_8948;
  ulong local_8940;
  stbi__context *local_8938;
  uint local_8930;
  uint local_892c;
  undefined1 local_8928 [64];
  undefined1 local_88e8 [64];
  stbi__gif local_88a8;
  undefined1 auVar71 [16];
  
  psVar44 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  local_88e8._0_4_ = bpc;
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8958 = (stbi__uint32 *)x;
  local_8950 = (stbi__uint32 *)y;
  local_8948 = comp;
  psVar26 = (stbi__jpeg *)malloc(0x4888);
  psVar26->s = s;
  psVar26->idct_block_kernel = stbi__idct_simd;
  psVar26->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar26->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar26->jfif = 0;
  psVar26->app14_color_transform = -1;
  psVar26->marker = 0xff;
  sVar15 = stbi__get_marker(psVar26);
  if (sVar15 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x3a8) = "no SOI";
  }
  psVar35 = s->img_buffer_original;
  psVar8 = s->img_buffer_original_end;
  s->img_buffer = psVar35;
  s->img_buffer_end = psVar8;
  free(psVar26);
  if (sVar15 == 0xd8) {
    psVar26 = (stbi__jpeg *)malloc(0x4888);
    psVar26->s = s;
    psVar26->idct_block_kernel = stbi__idct_simd;
    psVar26->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar26->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar26->img_comp;
      lVar27 = 0x46d8;
      do {
        psVar44 = psVar26->huff_dc[0].fast + lVar27 + -8;
        psVar44[0] = '\0';
        psVar44[1] = '\0';
        psVar44[2] = '\0';
        psVar44[3] = '\0';
        psVar44[4] = '\0';
        psVar44[5] = '\0';
        psVar44[6] = '\0';
        psVar44[7] = '\0';
        psVar44[8] = '\0';
        psVar44[9] = '\0';
        psVar44[10] = '\0';
        psVar44[0xb] = '\0';
        psVar44[0xc] = '\0';
        psVar44[0xd] = '\0';
        psVar44[0xe] = '\0';
        psVar44[0xf] = '\0';
        lVar27 = lVar27 + 0x60;
      } while (lVar27 != 0x4858);
      psVar26->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar26,0);
      uVar49 = extraout_EDX;
      if (iVar19 != 0) {
        bVar16 = stbi__get_marker(psVar26);
        local_8928._0_8_ = psVar26->huff_dc;
        local_88e8._0_8_ = psVar26->dequant;
        while (bVar16 != 0xda) {
          if (bVar16 == 0xdc) {
            iVar19 = stbi__get16be(psVar26->s);
            sVar20 = stbi__get16be(psVar26->s);
            paVar39 = extraout_RDX;
            if (iVar19 == 4) {
              if (sVar20 == psVar26->s->img_y) goto LAB_002d3238;
              pcVar31 = "bad DNL height";
            }
            else {
              pcVar31 = "bad DNL len";
            }
            goto LAB_002d3fe7;
          }
          if (bVar16 == 0xd9) {
            if ((psVar26->progressive != 0) && (0 < psVar26->s->img_n)) {
              lVar27 = 0;
              do {
                local_8928._0_8_ = lVar27;
                iVar19 = psVar26->img_comp[lVar27].y + 7 >> 3;
                if (0 < iVar19) {
                  uVar49 = paVar1[lVar27].x + 7 >> 3;
                  iVar52 = 0;
                  do {
                    if (0 < (int)uVar49) {
                      uVar41 = 0;
                      do {
                        psVar54 = paVar1[lVar27].coeff +
                                  (paVar1[lVar27].coeff_w * iVar52 + (int)uVar41) * 0x40;
                        iVar48 = paVar1[lVar27].tq;
                        lVar34 = 0;
                        do {
                          psVar54[lVar34] =
                               psVar54[lVar34] *
                               *(short *)((long)iVar48 * 0x80 + local_88e8._0_8_ + lVar34 * 2);
                          lVar34 = lVar34 + 1;
                        } while (lVar34 != 0x40);
                        (*psVar26->idct_block_kernel)
                                  (paVar1[lVar27].data +
                                   uVar41 * 8 + (long)(iVar52 * 8 * paVar1[lVar27].w2),
                                   paVar1[lVar27].w2,psVar54);
                        uVar41 = uVar41 + 1;
                      } while (uVar41 != uVar49);
                    }
                    iVar52 = iVar52 + 1;
                  } while (iVar52 != iVar19);
                }
                lVar27 = local_8928._0_8_ + 1;
              } while (lVar27 < psVar26->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar26->s->img_n) * 2 + 1;
            }
            uVar49 = psVar26->s->img_n;
            if (uVar49 == 3) {
              bVar57 = true;
              if (psVar26->rgb != 3) {
                if (psVar26->app14_color_transform != 0) goto LAB_002d3737;
                bVar57 = psVar26->jfif == 0;
              }
            }
            else {
LAB_002d3737:
              bVar57 = false;
            }
            uVar23 = 1;
            if (bVar57) {
              uVar23 = uVar49;
            }
            if (2 < req_comp) {
              uVar23 = uVar49;
            }
            if (uVar49 != 3) {
              uVar23 = uVar49;
            }
            local_8988 = (undefined1  [8])0x0;
            uStack_8980 = (stbi_uc *)0x0;
            uStack_8978 = (stbi_uc *)0x0;
            uStack_8970 = (stbi_uc *)0x0;
            if ((int)uVar23 < 1) {
LAB_002d38b1:
              psVar53 = psVar26->s;
              sVar20 = psVar53->img_y;
              psVar30 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar53->img_x,sVar20,1);
              auVar58 = local_88e8;
              iVar19 = (int)extraout_RDX_13;
              if (psVar30 != (stbi__context *)0x0) {
                data_00 = psVar30;
                if (sVar20 != 0) {
                  local_88e8._4_4_ = 0;
                  local_88e8._0_4_ = uVar23;
                  local_88e8._8_56_ = auVar58._8_56_;
                  iVar52 = 0;
                  uVar49 = 0;
                  local_8928._0_8_ = psVar30;
                  auVar40 = (undefined1  [8])extraout_RDX_13;
                  do {
                    sVar20 = psVar53->img_x;
                    if (0 < (int)uVar23) {
                      pasVar50 = (stbi_uc (*) [4])&local_88a8.ratio;
                      lVar27 = 0;
                      piVar55 = &psVar26->img_comp[0].y;
                      do {
                        asVar5 = pasVar50[-1];
                        asVar6 = pasVar50[-3];
                        iVar19 = (int)asVar6 >> 1;
                        auVar78 = (**(code **)(pasVar50 + -10))
                                            (*(stbi_uc **)(piVar55 + 10),
                                             *(undefined8 *)
                                              (*pasVar50 +
                                              ((ulong)(iVar19 <= (int)asVar5) << 3 |
                                              0xffffffffffffffe0)),
                                             *(undefined8 *)
                                              (*pasVar50 +
                                              ((ulong)((int)asVar5 < iVar19) << 3 |
                                              0xffffffffffffffe0)),pasVar50[-2]);
                        auVar40 = auVar78._8_8_;
                        *(long *)(local_8988 + lVar27 * 8) = auVar78._0_8_;
                        pasVar50[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar6 <= (int)asVar5 + 1) {
                          pasVar50[-1] = (stbi_uc  [4])0x0;
                          *(stbi_uc **)(pasVar50 + -8) = *(stbi_uc **)(pasVar50 + -6);
                          asVar5 = *pasVar50;
                          *pasVar50 = (stbi_uc  [4])((int)asVar5 + 1);
                          if ((int)asVar5 + 1 < *piVar55) {
                            *(stbi_uc **)(pasVar50 + -6) = *(stbi_uc **)(pasVar50 + -6) + piVar55[1]
                            ;
                          }
                        }
                        lVar27 = lVar27 + 1;
                        piVar55 = piVar55 + 0x18;
                        pasVar50 = pasVar50 + 0xc;
                      } while (local_88e8._0_8_ != lVar27);
                    }
                    data_00 = (stbi__context *)local_8928._0_8_;
                    if (req_comp < 3) {
                      psVar53 = psVar26->s;
                      if (bVar57) {
                        if (req_comp == 1) {
                          if (psVar53->img_x != 0) {
                            uVar41 = 0;
                            do {
                              bVar16 = uStack_8978[uVar41];
                              ((stbi_uc *)(local_8928._0_8_ + 0x38))
                              [uVar41 + sVar20 * iVar52 + -0x38] =
                                   (stbi_uc)((uint)bVar16 * 2 +
                                             ((uint)bVar16 + (uint)bVar16 * 8) * 3 +
                                             (uint)uStack_8980[uVar41] * 0x96 +
                                             (uint)*(byte *)((long)local_8988 + uVar41) * 0x4d >> 8)
                              ;
                              uVar41 = uVar41 + 1;
                              auVar40 = (undefined1  [8])uStack_8980;
                            } while (uVar41 < psVar53->img_x);
                          }
                        }
                        else if (psVar53->img_x != 0) {
                          uVar41 = 0;
                          do {
                            bVar16 = uStack_8978[uVar41];
                            ((stbi_uc *)(local_8928._0_8_ + 0x38))
                            [uVar41 * 2 + (ulong)(sVar20 * iVar52) + -0x38] =
                                 (stbi_uc)((uint)bVar16 * 2 + ((uint)bVar16 + (uint)bVar16 * 8) * 3
                                           + (uint)uStack_8980[uVar41] * 0x96 +
                                             (uint)*(byte *)((long)local_8988 + uVar41) * 0x4d >> 8)
                            ;
                            ((stbi_uc *)(local_8928._0_8_ + 0x38))
                            [uVar41 * 2 + (ulong)(sVar20 * iVar52) + -0x37] = 0xff;
                            uVar41 = uVar41 + 1;
                            auVar40 = (undefined1  [8])uStack_8980;
                          } while (uVar41 < psVar53->img_x);
                        }
                      }
                      else if (psVar53->img_n == 4) {
                        if (psVar26->app14_color_transform == 2) {
                          if (psVar53->img_x != 0) {
                            psVar44 = psVar30->buffer_start + ((ulong)(sVar20 * iVar52) - 0x37);
                            uVar41 = 0;
                            do {
                              iVar19 = (*(byte *)((long)local_8988 + uVar41) ^ 0xff) *
                                       (uint)uStack_8970[uVar41];
                              psVar44[-1] = (char)((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8);
                              *psVar44 = 0xff;
                              uVar41 = uVar41 + 1;
                              psVar44 = psVar44 + (uint)req_comp;
                              auVar40 = (undefined1  [8])uStack_8970;
                            } while (uVar41 < psVar53->img_x);
                          }
                        }
                        else {
                          if (psVar26->app14_color_transform != 0) goto LAB_002d3d2d;
                          if (psVar53->img_x != 0) {
                            psVar44 = psVar30->buffer_start + ((ulong)(sVar20 * iVar52) - 0x37);
                            uVar41 = 0;
                            do {
                              bVar16 = uStack_8970[uVar41];
                              iVar19 = (uint)*(byte *)((long)local_8988 + uVar41) * (uint)bVar16;
                              iVar48 = (uint)uStack_8980[uVar41] * (uint)bVar16;
                              psVar44[-1] = (char)((((uint)uStack_8978[uVar41] * (uint)bVar16 + 0x80
                                                    >> 8) + 0x80 +
                                                    (uint)uStack_8978[uVar41] * (uint)bVar16 >> 8 &
                                                   0xff) * 0x1d +
                                                   ((iVar48 + 0x80U >> 8) + 0x80 + iVar48 >> 8 &
                                                   0xff) * 0x96 +
                                                   ((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8 &
                                                   0xff) * 0x4d >> 8);
                              *psVar44 = 0xff;
                              uVar41 = uVar41 + 1;
                              psVar44 = psVar44 + (uint)req_comp;
                              auVar40 = local_8988;
                            } while (uVar41 < psVar53->img_x);
                          }
                        }
                      }
                      else {
LAB_002d3d2d:
                        uVar51 = psVar53->img_x;
                        auVar40 = (undefined1  [8])(ulong)uVar51;
                        if (req_comp == 1) {
                          if (uVar51 != 0) {
                            auVar40 = (undefined1  [8])0x0;
                            do {
                              ((stbi_uc *)(local_8928._0_8_ + 0x38) +
                              ((ulong)(sVar20 * iVar52) - 0x38))[(long)auVar40] =
                                   *(stbi_uc *)((long)local_8988 + (long)auVar40);
                              auVar40 = (undefined1  [8])((long)auVar40 + 1);
                            } while ((ulong)auVar40 < (stbi_uc *)(ulong)psVar53->img_x);
                          }
                        }
                        else if (uVar51 != 0) {
                          auVar40 = (undefined1  [8])0x0;
                          do {
                            ((stbi_uc *)(local_8928._0_8_ + 0x38))
                            [(long)auVar40 * 2 + (ulong)(sVar20 * iVar52) + -0x38] =
                                 *(stbi_uc *)((long)local_8988 + (long)auVar40);
                            ((stbi_uc *)(local_8928._0_8_ + 0x38))
                            [(long)auVar40 * 2 + (ulong)(sVar20 * iVar52) + -0x37] = 0xff;
                            auVar40 = (undefined1  [8])((long)auVar40 + 1);
                          } while ((ulong)auVar40 < (stbi_uc *)(ulong)psVar53->img_x);
                        }
                      }
                    }
                    else {
                      psVar44 = (stbi_uc *)(local_8928._0_8_ + 0x38) +
                                ((ulong)(uVar49 * req_comp * sVar20) - 0x38);
                      psVar53 = psVar26->s;
                      if (psVar53->img_n == 3) {
                        if (bVar57) {
                          if (psVar53->img_x != 0) {
                            psVar44 = psVar30->buffer_start + ((ulong)(sVar20 * iVar52) - 0x35);
                            uVar41 = 0;
                            do {
                              psVar44[-3] = *(stbi_uc *)((long)local_8988 + uVar41);
                              psVar44[-2] = uStack_8980[uVar41];
                              psVar44[-1] = uStack_8978[uVar41];
                              *psVar44 = 0xff;
                              uVar41 = uVar41 + 1;
                              psVar44 = psVar44 + (uint)req_comp;
                              auVar40 = (undefined1  [8])uStack_8978;
                            } while (uVar41 < psVar53->img_x);
                          }
                        }
                        else {
LAB_002d3d97:
                          (*psVar26->YCbCr_to_RGB_kernel)
                                    (psVar44,(stbi_uc *)local_8988,uStack_8980,uStack_8978,
                                     psVar53->img_x,req_comp);
                          auVar40 = (undefined1  [8])extraout_RDX_14;
                        }
                      }
                      else {
                        auVar78[8] = 0xff;
                        auVar78._0_8_ = 0xffffffffffffffff;
                        auVar78[9] = 0xff;
                        auVar78[10] = 0xff;
                        auVar78[0xb] = 0xff;
                        auVar78[0xc] = 0xff;
                        auVar78[0xd] = 0xff;
                        auVar78[0xe] = 0xff;
                        auVar78[0xf] = 0xff;
                        if (psVar53->img_n == 4) {
                          if (psVar26->app14_color_transform == 2) {
                            (*psVar26->YCbCr_to_RGB_kernel)
                                      (psVar44,(stbi_uc *)local_8988,uStack_8980,uStack_8978,
                                       psVar53->img_x,req_comp);
                            psVar53 = psVar26->s;
                            auVar40 = (undefined1  [8])extraout_RDX_15;
                            if (psVar53->img_x != 0) {
                              psVar44 = psVar30->buffer_start + ((ulong)(sVar20 * iVar52) - 0x36);
                              auVar40 = (undefined1  [8])0x0;
                              do {
                                bVar16 = uStack_8970[(long)auVar40];
                                iVar19 = (psVar44[-2] ^ 0xff) * (uint)bVar16;
                                psVar44[-2] = (byte)((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8);
                                iVar19 = (psVar44[-1] ^ 0xff) * (uint)bVar16;
                                psVar44[-1] = (byte)((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8);
                                iVar19 = (*psVar44 ^ 0xff) * (uint)bVar16;
                                *psVar44 = (byte)((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8);
                                auVar40 = (undefined1  [8])((long)auVar40 + 1);
                                psVar44 = psVar44 + (uint)req_comp;
                              } while ((ulong)auVar40 < (stbi_uc *)(ulong)psVar53->img_x);
                            }
                          }
                          else {
                            if (psVar26->app14_color_transform != 0) goto LAB_002d3d97;
                            if (psVar53->img_x != 0) {
                              psVar44 = psVar30->buffer_start + ((ulong)(sVar20 * iVar52) - 0x35);
                              uVar41 = 0;
                              do {
                                bVar16 = uStack_8970[uVar41];
                                iVar19 = (uint)*(byte *)((long)local_8988 + uVar41) * (uint)bVar16;
                                psVar44[-3] = (char)((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8);
                                iVar19 = (uint)uStack_8980[uVar41] * (uint)bVar16;
                                psVar44[-2] = (char)((iVar19 + 0x80U >> 8) + 0x80 + iVar19 >> 8);
                                psVar44[-1] = (char)(((uint)uStack_8978[uVar41] * (uint)bVar16 +
                                                      0x80 >> 8) + 0x80 +
                                                     (uint)uStack_8978[uVar41] * (uint)bVar16 >> 8);
                                *psVar44 = 0xff;
                                uVar41 = uVar41 + 1;
                                psVar44 = psVar44 + (uint)req_comp;
                                auVar40 = (undefined1  [8])uStack_8980;
                              } while (uVar41 < psVar53->img_x);
                            }
                          }
                        }
                        else if (psVar53->img_x != 0) {
                          psVar35 = (stbi_uc *)0x0;
                          do {
                            auVar71 = vpinsrb_avx(auVar78,(uint)*(byte *)((long)local_8988 +
                                                                         (long)psVar35),0);
                            auVar71 = vpshufb_avx(auVar71,SUB6416(ZEXT464(0x1000000),0));
                            *(int *)psVar44 = auVar71._0_4_;
                            psVar44 = psVar44 + (uint)req_comp;
                            psVar35 = psVar35 + 1;
                            auVar40 = (undefined1  [8])(ulong)psVar53->img_x;
                          } while (psVar35 < (ulong)auVar40);
                        }
                      }
                    }
                    iVar19 = SUB84(auVar40,0);
                    uVar49 = uVar49 + 1;
                    psVar53 = psVar26->s;
                    iVar52 = iVar52 + req_comp;
                  } while (uVar49 < psVar53->img_y);
                }
                stbi__free_jpeg_components(psVar26,psVar53->img_n,iVar19);
                psVar53 = psVar26->s;
                *local_8958 = psVar53->img_x;
                *local_8950 = psVar53->img_y;
                if (local_8948 != (int *)0x0) {
                  *local_8948 = (uint)(2 < psVar53->img_n) * 2 + 1;
                }
                goto LAB_002d4005;
              }
              stbi__free_jpeg_components(psVar26,psVar53->img_n,iVar19);
              *(char **)(in_FS_OFFSET + -0x3a8) = "outofmem";
            }
            else {
              lVar27 = 0;
              while( true ) {
                psVar53 = psVar26->s;
                sVar20 = psVar53->img_x;
                pvVar28 = malloc((ulong)(sVar20 + 3));
                *(void **)((long)&psVar26->img_comp[0].linebuf + lVar27 * 2) = pvVar28;
                if (pvVar28 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar26,psVar53->img_n,why);
                  *(char **)(in_FS_OFFSET + -0x3a8) = "outofmem";
                }
                else {
                  uVar41 = (long)psVar26->img_h_max /
                           (long)*(int *)((long)&psVar26->img_comp[0].h + lVar27 * 2);
                  iVar19 = (int)uVar41;
                  *(int *)((long)(local_88a8.pal + -7) + lVar27) = iVar19;
                  iVar52 = psVar26->img_v_max / *(int *)((long)&psVar26->img_comp[0].v + lVar27 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar27) = iVar52;
                  *(int *)((long)(local_88a8.pal + -4) + lVar27) = iVar52 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar27) =
                       (int)((ulong)((sVar20 - 1) + iVar19) / (uVar41 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar27) = 0;
                  uVar9 = *(undefined8 *)((long)&psVar26->img_comp[0].data + lVar27 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar27) = uVar9;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar27) = uVar9;
                  if ((iVar19 == 1) && (iVar52 == 1)) {
                    pcVar29 = resample_row_1;
                  }
                  else if ((iVar19 == 1) && (iVar52 == 2)) {
                    pcVar29 = stbi__resample_row_v_2;
                  }
                  else if ((iVar19 == 2) && (iVar52 == 1)) {
                    pcVar29 = stbi__resample_row_h_2;
                  }
                  else if ((iVar19 == 2) && (iVar52 == 2)) {
                    pcVar29 = psVar26->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar29 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar27) = pcVar29;
                }
                if (pvVar28 == (void *)0x0) break;
                lVar27 = lVar27 + 0x30;
                if ((ulong)uVar23 * 0x30 == lVar27) goto LAB_002d38b1;
              }
            }
            data_00 = (stbi__context *)0x0;
            goto LAB_002d4005;
          }
          iVar19 = stbi__process_marker(psVar26,(uint)bVar16);
          uVar49 = extraout_EDX_00;
          if (iVar19 == 0) goto LAB_002d3ff0;
LAB_002d3238:
          bVar16 = stbi__get_marker(psVar26);
        }
        iVar19 = stbi__get16be(psVar26->s);
        psVar53 = psVar26->s;
        pbVar32 = psVar53->img_buffer;
        paVar39 = extraout_RDX_00;
        if (pbVar32 < psVar53->img_buffer_end) {
LAB_002d1fd6:
          psVar53->img_buffer = pbVar32 + 1;
          bVar16 = *pbVar32;
        }
        else {
          if (psVar53->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar53);
            pbVar32 = psVar53->img_buffer;
            paVar39 = extraout_RDX_01;
            goto LAB_002d1fd6;
          }
          bVar16 = 0;
        }
        psVar26->scan_n = (uint)bVar16;
        if (((byte)(bVar16 - 5) < 0xfc) || (psVar26->s->img_n < (int)(uint)bVar16)) {
          pcVar31 = "bad SOS component count";
        }
        else {
          if (iVar19 == bVar16 + 6 + (uint)bVar16) {
            if (bVar16 != 0) {
              lVar27 = 0;
              do {
                psVar53 = psVar26->s;
                pbVar32 = psVar53->img_buffer;
                if (pbVar32 < psVar53->img_buffer_end) {
LAB_002d204a:
                  psVar53->img_buffer = pbVar32 + 1;
                  uVar23 = (uint)*pbVar32;
                }
                else {
                  if (psVar53->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar53);
                    pbVar32 = psVar53->img_buffer;
                    goto LAB_002d204a;
                  }
                  uVar23 = 0;
                }
                psVar53 = psVar26->s;
                pbVar32 = psVar53->img_buffer;
                if (pbVar32 < psVar53->img_buffer_end) {
LAB_002d2085:
                  psVar53->img_buffer = pbVar32 + 1;
                  bVar16 = *pbVar32;
                }
                else {
                  if (psVar53->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar53);
                    pbVar32 = psVar53->img_buffer;
                    goto LAB_002d2085;
                  }
                  bVar16 = 0;
                }
                uVar49 = psVar26->s->img_n;
                if ((int)uVar49 < 1) {
                  uVar41 = 0;
                }
                else {
                  uVar41 = 0;
                  paVar39 = paVar1;
                  do {
                    if (paVar39->id == uVar23) goto LAB_002d20b8;
                    uVar41 = uVar41 + 1;
                    paVar39 = paVar39 + 1;
                  } while (uVar49 != uVar41);
                  uVar41 = (ulong)uVar49;
                }
LAB_002d20b8:
                if ((uint)uVar41 == uVar49) goto LAB_002d3ff0;
                uVar43 = uVar41 & 0xffffffff;
                paVar39 = (anon_struct_96_18_0d0905d3 *)(uVar43 * 0x60);
                psVar26->img_comp[uVar43].hd = (uint)(bVar16 >> 4);
                if (0x3f < bVar16) {
                  pcVar31 = "bad DC huff";
                  goto LAB_002d3fe7;
                }
                paVar39 = paVar1 + uVar43;
                paVar39->ha = bVar16 & 0xf;
                if (3 < (bVar16 & 0xf)) {
                  pcVar31 = "bad AC huff";
                  goto LAB_002d3fe7;
                }
                psVar26->order[lVar27] = (uint)uVar41;
                lVar27 = lVar27 + 1;
              } while (lVar27 < psVar26->scan_n);
            }
            psVar53 = psVar26->s;
            pbVar32 = psVar53->img_buffer;
            if (pbVar32 < psVar53->img_buffer_end) {
LAB_002d214a:
              psVar53->img_buffer = pbVar32 + 1;
              uVar49 = (uint)*pbVar32;
            }
            else {
              if (psVar53->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar53);
                pbVar32 = psVar53->img_buffer;
                goto LAB_002d214a;
              }
              uVar49 = 0;
            }
            psVar26->spec_start = uVar49;
            psVar53 = psVar26->s;
            pbVar32 = psVar53->img_buffer;
            if (pbVar32 < psVar53->img_buffer_end) {
LAB_002d218c:
              psVar53->img_buffer = pbVar32 + 1;
              uVar49 = (uint)*pbVar32;
            }
            else {
              if (psVar53->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar53);
                pbVar32 = psVar53->img_buffer;
                goto LAB_002d218c;
              }
              uVar49 = 0;
            }
            psVar26->spec_end = uVar49;
            psVar53 = psVar26->s;
            pbVar32 = psVar53->img_buffer;
            if (pbVar32 < psVar53->img_buffer_end) {
LAB_002d21ce:
              psVar53->img_buffer = pbVar32 + 1;
              bVar16 = *pbVar32;
            }
            else {
              if (psVar53->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar53);
                pbVar32 = psVar53->img_buffer;
                goto LAB_002d21ce;
              }
              bVar16 = 0;
            }
            psVar26->succ_high = (uint)(bVar16 >> 4);
            uVar49 = bVar16 & 0xf;
            paVar39 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar49;
            psVar26->succ_low = uVar49;
            iVar19 = psVar26->progressive;
            iVar52 = psVar26->spec_start;
            if (iVar19 == 0) {
              if (((iVar52 != 0) || (0xf < bVar16)) || ((bVar16 & 0xf) != 0)) goto LAB_002d35f4;
              psVar26->spec_end = 0x3f;
            }
            else if (((0x3f < iVar52) || (0x3f < psVar26->spec_end)) ||
                    ((psVar26->spec_end < iVar52 || ((0xdf < bVar16 || (0xd < uVar49)))))) {
LAB_002d35f4:
              pcVar31 = "bad SOS";
              goto LAB_002d3fe7;
            }
            iVar52 = psVar26->scan_n;
            uVar41 = (ulong)(uint)psVar26->restart_interval;
            if (psVar26->restart_interval == 0) {
              uVar41 = 0x7fffffff;
            }
            psVar26->code_buffer = 0;
            psVar26->code_bits = 0;
            psVar26->nomore = 0;
            psVar26->img_comp[3].dc_pred = 0;
            psVar26->img_comp[2].dc_pred = 0;
            psVar26->img_comp[1].dc_pred = 0;
            psVar26->img_comp[0].dc_pred = 0;
            psVar26->marker = 0xff;
            uVar49 = (uint)uVar41;
            psVar26->todo = uVar49;
            psVar26->eob_run = 0;
            if (iVar19 == 0) {
              if (iVar52 == 1) {
                iVar52 = psVar26->order[0];
                iVar48 = psVar26->img_comp[iVar52].y + 7 >> 3;
                iVar19 = 1;
                if (0 < iVar48) {
                  uVar23 = paVar1[iVar52].x + 7 >> 3;
                  iVar21 = 0;
                  iVar19 = 0;
                  do {
                    if (0 < (int)uVar23) {
                      lVar27 = 0;
                      do {
                        iVar22 = stbi__jpeg_decode_block
                                           (psVar26,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            ((long)paVar1[iVar52].hd * 0x690 + local_8928._0_8_),
                                            (stbi__huffman *)
                                            psVar26->huff_ac[paVar1[iVar52].ha].fast,
                                            psVar26->fast_ac[paVar1[iVar52].ha],iVar52,
                                            (stbi__uint16 *)
                                            ((long)paVar1[iVar52].tq * 0x80 + local_88e8._0_8_));
                        if (iVar22 == 0) {
                          bVar57 = false;
                          local_89e8 = 0;
                          uVar41 = extraout_RDX_07;
                        }
                        else {
                          (*psVar26->idct_block_kernel)
                                    (paVar1[iVar52].data + lVar27 + iVar21 * paVar1[iVar52].w2,
                                     paVar1[iVar52].w2,(short *)&local_88a8);
                          iVar22 = psVar26->todo;
                          psVar26->todo = iVar22 + -1;
                          bVar57 = true;
                          uVar41 = extraout_RDX_08;
                          if (iVar22 < 2) {
                            if (psVar26->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar26);
                              uVar41 = extraout_RDX_09;
                            }
                            if ((psVar26->marker & 0xf8) == 0xd0) {
                              psVar26->code_buffer = 0;
                              psVar26->code_bits = 0;
                              psVar26->nomore = 0;
                              psVar26->img_comp[3].dc_pred = 0;
                              psVar26->img_comp[2].dc_pred = 0;
                              psVar26->img_comp[1].dc_pred = 0;
                              psVar26->img_comp[0].dc_pred = 0;
                              psVar26->marker = 0xff;
                              iVar22 = psVar26->restart_interval;
                              uVar41 = 0x7fffffff;
                              if (iVar22 == 0) {
                                iVar22 = 0x7fffffff;
                              }
                              psVar26->todo = iVar22;
                              psVar26->eob_run = 0;
                            }
                            else {
                              local_89e8 = 1;
                              bVar57 = false;
                            }
                          }
                        }
                        uVar49 = (uint)uVar41;
                        if (!bVar57) {
                          iVar19 = (int)local_89e8;
                          goto LAB_002d3225;
                        }
                        lVar27 = lVar27 + 8;
                      } while ((ulong)uVar23 * 8 - lVar27 != 0);
                    }
                    uVar49 = (uint)uVar41;
                    iVar19 = iVar19 + 1;
                    iVar21 = iVar21 + 8;
                  } while (iVar19 != iVar48);
                  iVar19 = 1;
                }
              }
              else {
                iVar19 = 1;
                if (0 < psVar26->img_mcu_y) {
                  iVar52 = 0;
                  do {
                    if (0 < psVar26->img_mcu_x) {
                      iVar48 = 0;
                      do {
                        if (0 < psVar26->scan_n) {
                          uVar43 = 0;
                          do {
                            local_89b8 = uVar43;
                            iVar19 = psVar26->order[local_89b8];
                            local_89e8 = (ulong)iVar19;
                            if (0 < psVar26->img_comp[local_89e8].v) {
                              iVar21 = 0;
                              bVar57 = true;
                              do {
                                iVar22 = paVar1[local_89e8].h;
                                if (0 < iVar22) {
                                  iVar45 = 0;
                                  do {
                                    iVar25 = paVar1[local_89e8].v;
                                    iVar38 = stbi__jpeg_decode_block
                                                       (psVar26,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        ((long)paVar1[local_89e8].hd * 0x690 +
                                                        local_8928._0_8_),
                                                        (stbi__huffman *)
                                                        psVar26->huff_ac[paVar1[local_89e8].ha].fast
                                                        ,psVar26->fast_ac[paVar1[local_89e8].ha],
                                                        iVar19,(stbi__uint16 *)
                                                               ((long)paVar1[local_89e8].tq * 0x80 +
                                                               local_88e8._0_8_));
                                    uVar49 = (uint)extraout_RDX_11;
                                    if (iVar38 == 0) {
                                      uVar41 = extraout_RDX_11;
                                      if (!bVar57) goto LAB_002d3122;
                                      goto LAB_002d320a;
                                    }
                                    (*psVar26->idct_block_kernel)
                                              (paVar1[local_89e8].data +
                                               (long)((iVar22 * iVar48 + iVar45) * 8) +
                                               (long)((iVar25 * iVar52 + iVar21) *
                                                      paVar1[local_89e8].w2 * 8),
                                               paVar1[local_89e8].w2,(short *)&local_88a8);
                                    iVar45 = iVar45 + 1;
                                    iVar22 = paVar1[local_89e8].h;
                                    uVar41 = extraout_RDX_12;
                                  } while (iVar45 < iVar22);
                                }
                                iVar21 = iVar21 + 1;
                                bVar57 = iVar21 < paVar1[local_89e8].v;
                              } while (iVar21 < paVar1[local_89e8].v);
                            }
LAB_002d3122:
                            uVar43 = local_89b8 + 1;
                          } while ((long)(local_89b8 + 1) < (long)psVar26->scan_n);
                        }
                        uVar49 = (uint)uVar41;
                        iVar21 = psVar26->todo;
                        psVar26->todo = iVar21 + -1;
                        iVar19 = 1;
                        if (iVar21 < 2) {
                          if (psVar26->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar26);
                            uVar49 = extraout_EDX_02;
                          }
                          if ((psVar26->marker & 0xf8) != 0xd0) goto LAB_002d3225;
                          psVar26->code_buffer = 0;
                          psVar26->code_bits = 0;
                          psVar26->nomore = 0;
                          psVar26->img_comp[3].dc_pred = 0;
                          psVar26->img_comp[2].dc_pred = 0;
                          psVar26->img_comp[1].dc_pred = 0;
                          psVar26->img_comp[0].dc_pred = 0;
                          psVar26->marker = 0xff;
                          iVar19 = psVar26->restart_interval;
                          uVar41 = 0x7fffffff;
                          if (iVar19 == 0) {
                            iVar19 = 0x7fffffff;
                          }
                          psVar26->todo = iVar19;
                          psVar26->eob_run = 0;
                        }
                        iVar48 = iVar48 + 1;
                      } while (iVar48 < psVar26->img_mcu_x);
                    }
                    uVar49 = (uint)uVar41;
                    iVar19 = 1;
                    iVar52 = iVar52 + 1;
                  } while (iVar52 < psVar26->img_mcu_y);
                }
              }
            }
            else if (iVar52 == 1) {
              iVar52 = psVar26->order[0];
              iVar48 = psVar26->img_comp[iVar52].y + 7 >> 3;
              iVar19 = 1;
              if (0 < iVar48) {
                iVar21 = psVar26->img_comp[iVar52].x + 7 >> 3;
                local_89dc = 0;
                do {
                  if (0 < iVar21) {
                    iVar19 = 0;
                    do {
                      psVar54 = paVar1[iVar52].coeff +
                                (paVar1[iVar52].coeff_w * local_89dc + iVar19) * 0x40;
                      uVar43 = (ulong)psVar26->spec_start;
                      if (uVar43 == 0) {
                        iVar22 = stbi__jpeg_decode_block_prog_dc
                                           (psVar26,psVar54,
                                            (stbi__huffman *)
                                            ((long)paVar1[iVar52].hd * 0x690 + local_8928._0_8_),
                                            iVar52);
                        uVar41 = extraout_RDX_03;
                        if (iVar22 != 0) goto LAB_002d2801;
                        bVar57 = false;
                        local_89b8 = 0;
                      }
                      else {
                        iVar22 = paVar1[iVar52].ha;
                        uVar49 = psVar26->succ_low;
                        iVar45 = psVar26->eob_run;
                        if (psVar26->succ_high == 0) {
                          if (iVar45 == 0) {
                            do {
                              if (psVar26->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar26);
                              }
                              sVar3 = psVar26->fast_ac[iVar22][psVar26->code_buffer >> 0x17];
                              uVar23 = (uint)sVar3;
                              iVar45 = (int)uVar43;
                              if (sVar3 == 0) {
                                if (psVar26->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar26);
                                }
                                uVar23 = psVar26->code_buffer;
                                uVar41 = (ulong)psVar26->huff_ac[iVar22].fast[uVar23 >> 0x17];
                                if (uVar41 == 0xff) {
                                  lVar27 = 0;
                                  do {
                                    lVar34 = lVar27;
                                    lVar27 = lVar34 + 1;
                                  } while (psVar26->huff_ac[iVar22].maxcode[lVar34 + 10] <=
                                           uVar23 >> 0x10);
                                  uVar51 = psVar26->code_bits;
                                  uVar47 = (ulong)uVar51;
                                  if (lVar27 == 8) {
                                    uVar47 = (ulong)(uVar51 - 0x10);
                                    psVar26->code_bits = uVar51 - 0x10;
                                    uVar24 = 0xffffffff;
                                  }
                                  else {
                                    uVar36 = (int)lVar34 + 10;
                                    uVar24 = 0xffffffff;
                                    if ((int)uVar36 <= (int)uVar51) {
                                      iVar25 = (uVar23 >> ((byte)(0x17 - (char)lVar27) & 0x1f) &
                                               stbi__bmask[lVar34 + 10]) +
                                               psVar26->huff_ac[iVar22].delta[lVar34 + 10];
                                      bVar16 = psVar26->huff_ac[iVar22].size[iVar25];
                                      if ((uVar23 >> ((byte)-bVar16 & 0x1f) & stbi__bmask[bVar16])
                                          != (uint)psVar26->huff_ac[iVar22].code[iVar25])
                                      goto LAB_002d62a6;
                                      uVar51 = (uVar51 - (int)lVar27) - 9;
                                      uVar47 = (ulong)uVar51;
                                      psVar26->code_bits = uVar51;
                                      psVar26->code_buffer = uVar23 << (uVar36 & 0x1f);
                                      uVar24 = (uint)psVar26->huff_ac[iVar22].values[iVar25];
                                    }
                                  }
                                }
                                else {
                                  bVar16 = psVar26->huff_ac[iVar22].size[uVar41];
                                  uVar24 = 0xffffffff;
                                  uVar51 = psVar26->code_bits - (uint)bVar16;
                                  uVar47 = (ulong)uVar51;
                                  if ((int)(uint)bVar16 <= psVar26->code_bits) {
                                    psVar26->code_buffer = uVar23 << (bVar16 & 0x1f);
                                    psVar26->code_bits = uVar51;
                                    uVar24 = (uint)psVar26->huff_ac[iVar22].values[uVar41];
                                  }
                                }
                                if ((int)uVar24 < 0) {
                                  *(char **)(in_FS_OFFSET + -0x3a8) = "bad huffman code";
                                  iVar25 = 1;
LAB_002d2bcb:
                                  uVar41 = 0;
                                }
                                else {
                                  uVar23 = uVar24 >> 4;
                                  uVar51 = uVar24 & 0xf;
                                  if (uVar51 == 0) {
                                    if (uVar24 < 0xf0) {
                                      psVar26->eob_run = 1 << (uVar23 & 0x1f);
                                      if (0xf < uVar24) {
                                        if (psVar26->code_bits < (int)uVar23) {
                                          local_89e8 = (ulong)uVar23;
                                          stbi__grow_buffer_unsafe(psVar26);
                                        }
                                        bVar16 = (byte)uVar23 & 0x1f;
                                        uVar36 = psVar26->code_buffer << bVar16 |
                                                 psVar26->code_buffer >> 0x20 - bVar16;
                                        uVar51 = stbi__bmask[uVar23];
                                        psVar26->code_buffer = ~uVar51 & uVar36;
                                        psVar26->code_bits = psVar26->code_bits - uVar23;
                                        psVar26->eob_run = psVar26->eob_run + (uVar36 & uVar51);
                                      }
                                      psVar26->eob_run = psVar26->eob_run + -1;
                                      iVar25 = 2;
                                      goto LAB_002d2bcb;
                                    }
                                    uVar43 = (ulong)(iVar45 + 0x10);
                                    iVar25 = 0;
                                    uVar41 = CONCAT71((int7)(uVar47 >> 8),1);
                                  }
                                  else {
                                    bVar16 = ""[(long)iVar45 + (ulong)uVar23];
                                    if (psVar26->code_bits < (int)uVar51) {
                                      stbi__grow_buffer_unsafe(psVar26);
                                    }
                                    uVar36 = psVar26->code_buffer;
                                    uVar37 = uVar36 << (sbyte)uVar51 |
                                             uVar36 >> 0x20 - (sbyte)uVar51;
                                    uVar24 = *(uint *)((long)stbi__bmask + (ulong)(uVar51 * 4));
                                    psVar26->code_buffer = ~uVar24 & uVar37;
                                    psVar26->code_bits = psVar26->code_bits - uVar51;
                                    iVar25 = 0;
                                    iVar38 = 0;
                                    if (-1 < (int)uVar36) {
                                      iVar38 = *(int *)((long)stbi__jbias + (ulong)(uVar51 * 4));
                                    }
                                    uVar43 = (ulong)((int)((long)iVar45 + (ulong)uVar23) + 1);
                                    iVar38 = (uVar37 & uVar24) + iVar38;
                                    psVar54[bVar16] = (short)(iVar38 << (uVar49 & 0x1f));
                                    uVar41 = CONCAT71((uint7)(uint3)((uint)iVar38 >> 8),1);
                                  }
                                }
                              }
                              else {
                                lVar27 = (long)iVar45 + (ulong)(uVar23 >> 4 & 0xf);
                                psVar26->code_buffer = psVar26->code_buffer << (uVar23 & 0xf);
                                psVar26->code_bits = psVar26->code_bits - (uVar23 & 0xf);
                                uVar43 = (ulong)((int)lVar27 + 1);
                                psVar54[""[lVar27]] = (short)((uVar23 >> 8) << (uVar49 & 0x1f));
                                iVar25 = 0 << (uVar49 & 0x1f);
                                uVar41 = CONCAT71((uint7)(uint3)(uVar49 >> 8),1);
                              }
                              bVar57 = false;
                              cVar17 = '\x01';
                              if (iVar25 != 0) {
                                bVar57 = false;
                                if (iVar25 != 2) {
                                  cVar17 = (char)uVar41;
                                  bVar57 = false;
                                }
                                break;
                              }
                            } while ((int)uVar43 <= psVar26->spec_end);
                          }
                          else {
                            psVar26->eob_run = iVar45 + -1;
                            cVar17 = '\0';
                            bVar57 = true;
                          }
                          if (cVar17 != '\0') goto LAB_002d27de;
                        }
                        else {
                          if (iVar45 == 0) {
                            uVar23 = (0x10000 << (uVar49 & 0x1f)) >> 0x10;
                            do {
                              if (psVar26->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar26);
                              }
                              uVar51 = psVar26->code_buffer;
                              uVar47 = (ulong)psVar26->huff_ac[iVar22].fast[uVar51 >> 0x17];
                              if (uVar47 == 0xff) {
                                lVar27 = 0;
                                do {
                                  lVar34 = lVar27;
                                  lVar27 = lVar34 + 1;
                                } while (psVar26->huff_ac[iVar22].maxcode[lVar34 + 10] <=
                                         uVar51 >> 0x10);
                                uVar36 = psVar26->code_bits;
                                uVar41 = (ulong)uVar36;
                                if (lVar27 == 8) {
                                  uVar41 = (ulong)(uVar36 - 0x10);
                                  psVar26->code_bits = uVar36 - 0x10;
                                  uVar24 = 0xffffffff;
                                }
                                else {
                                  uVar37 = (int)lVar34 + 10;
                                  uVar24 = 0xffffffff;
                                  if ((int)uVar37 <= (int)uVar36) {
                                    iVar45 = (uVar51 >> ((byte)(0x17 - (char)lVar27) & 0x1f) &
                                             stbi__bmask[lVar34 + 10]) +
                                             psVar26->huff_ac[iVar22].delta[lVar34 + 10];
                                    bVar16 = psVar26->huff_ac[iVar22].size[iVar45];
                                    if ((uVar51 >> ((byte)-bVar16 & 0x1f) & stbi__bmask[bVar16]) !=
                                        (uint)psVar26->huff_ac[iVar22].code[iVar45]) {
LAB_002d62a6:
                                      pbrt::LogFatal<char_const(&)[82]>
                                                (Fatal,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                                                 ,0x81a,"Check failed: %s",
                                                 (char (*) [82])
                                                 "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                );
                                    }
                                    uVar36 = (uVar36 - (int)lVar27) - 9;
                                    uVar41 = (ulong)uVar36;
                                    psVar26->code_bits = uVar36;
                                    psVar26->code_buffer = uVar51 << (uVar37 & 0x1f);
                                    uVar24 = (uint)psVar26->huff_ac[iVar22].values[iVar45];
                                  }
                                }
                              }
                              else {
                                bVar16 = psVar26->huff_ac[iVar22].size[uVar47];
                                uVar24 = 0xffffffff;
                                uVar36 = psVar26->code_bits - (uint)bVar16;
                                uVar41 = (ulong)uVar36;
                                if ((int)(uint)bVar16 <= psVar26->code_bits) {
                                  psVar26->code_buffer = uVar51 << (bVar16 & 0x1f);
                                  psVar26->code_bits = uVar36;
                                  uVar24 = (uint)psVar26->huff_ac[iVar22].values[uVar47];
                                }
                              }
                              if ((int)uVar24 < 0) {
                                *(char **)(in_FS_OFFSET + -0x3a8) = "bad huffman code";
                                bVar57 = false;
                              }
                              else {
                                uVar51 = uVar24 >> 4;
                                if ((uVar24 & 0xf) == 1) {
                                  if (psVar26->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar26);
                                    uVar41 = extraout_RDX_04;
                                  }
                                  uVar36 = psVar26->code_buffer;
                                  psVar26->code_buffer = uVar36 * 2;
                                  psVar26->code_bits = psVar26->code_bits + -1;
                                  local_89e8 = (ulong)(((int)~uVar36 >> 0x1f | 1U) <<
                                                      (uVar49 & 0x1f));
                                }
                                else {
                                  if ((uVar24 & 0xf) != 0) {
                                    *(char **)(in_FS_OFFSET + -0x3a8) = "bad huffman code";
                                    bVar57 = false;
                                    goto LAB_002d27c9;
                                  }
                                  if (uVar24 < 0xf0) {
                                    psVar26->eob_run = ~(-1 << (uVar51 & 0x1f));
                                    if (0xf < uVar24) {
                                      if (psVar26->code_bits < (int)uVar51) {
                                        stbi__grow_buffer_unsafe(psVar26);
                                      }
                                      bVar16 = (byte)uVar51 & 0x1f;
                                      uVar24 = psVar26->code_buffer << bVar16 |
                                               psVar26->code_buffer >> 0x20 - bVar16;
                                      uVar36 = stbi__bmask[uVar51];
                                      uVar37 = ~uVar36 & uVar24;
                                      uVar41 = (ulong)uVar37;
                                      psVar26->code_buffer = uVar37;
                                      psVar26->code_bits = psVar26->code_bits - uVar51;
                                      psVar26->eob_run = psVar26->eob_run + (uVar24 & uVar36);
                                    }
                                    local_89e8 = 0;
                                    uVar51 = 0x40;
                                  }
                                  else {
                                    local_89e8 = 0;
                                    uVar51 = 0xf;
                                  }
                                }
                                uVar43 = (ulong)(int)uVar43;
                                do {
                                  if ((long)psVar26->spec_end < (long)uVar43) break;
                                  bVar16 = ""[uVar43];
                                  if (psVar54[bVar16] == 0) {
                                    if (uVar51 == 0) {
                                      psVar54[bVar16] = (short)local_89e8;
                                      bVar57 = false;
                                      uVar51 = 0;
                                    }
                                    else {
                                      uVar51 = uVar51 - 1;
                                      bVar57 = true;
                                    }
                                  }
                                  else {
                                    if (psVar26->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar26);
                                      uVar41 = extraout_RDX_05;
                                    }
                                    sVar20 = psVar26->code_buffer;
                                    psVar26->code_buffer = sVar20 * 2;
                                    psVar26->code_bits = psVar26->code_bits + -1;
                                    bVar57 = true;
                                    if (((int)sVar20 < 0) &&
                                       (sVar3 = psVar54[bVar16], (uVar23 & (int)sVar3) == 0)) {
                                      uVar36 = uVar23;
                                      if (sVar3 < 1) {
                                        uVar36 = -uVar23;
                                      }
                                      psVar54[bVar16] = sVar3 + (short)uVar36;
                                    }
                                  }
                                  uVar43 = uVar43 + 1;
                                } while (bVar57);
                                bVar57 = true;
                              }
LAB_002d27c9:
                              if (!bVar57) {
                                bVar57 = false;
                                goto LAB_002d27e3;
                              }
                            } while ((int)uVar43 <= psVar26->spec_end);
                          }
                          else {
                            psVar26->eob_run = iVar45 + -1;
                            if (psVar26->spec_start <= psVar26->spec_end) {
                              uVar49 = (0x10000 << (uVar49 & 0x1f)) >> 0x10;
                              do {
                                bVar16 = ""[uVar43];
                                if (psVar54[bVar16] != 0) {
                                  if (psVar26->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar26);
                                    uVar41 = extraout_RDX_02;
                                  }
                                  sVar20 = psVar26->code_buffer;
                                  psVar26->code_buffer = sVar20 * 2;
                                  psVar26->code_bits = psVar26->code_bits + -1;
                                  if (((int)sVar20 < 0) &&
                                     (sVar3 = psVar54[bVar16], (uVar49 & (int)sVar3) == 0)) {
                                    uVar23 = -uVar49;
                                    if (0 < sVar3) {
                                      uVar23 = uVar49;
                                    }
                                    psVar54[bVar16] = (short)uVar23 + sVar3;
                                  }
                                }
                                bVar57 = (long)uVar43 < (long)psVar26->spec_end;
                                uVar43 = uVar43 + 1;
                              } while (bVar57);
                            }
                          }
LAB_002d27de:
                          bVar57 = true;
                        }
LAB_002d27e3:
                        if (!bVar57) {
                          local_89b8._0_4_ = 0;
                        }
                        local_89b8 = (ulong)(uint)local_89b8;
                        if (!bVar57) {
                          bVar57 = false;
                        }
                        else {
LAB_002d2801:
                          iVar22 = psVar26->todo;
                          psVar26->todo = iVar22 + -1;
                          bVar57 = true;
                          if (iVar22 < 2) {
                            if (psVar26->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar26);
                              uVar41 = extraout_RDX_06;
                            }
                            if ((psVar26->marker & 0xf8) == 0xd0) {
                              psVar26->code_buffer = 0;
                              psVar26->code_bits = 0;
                              psVar26->nomore = 0;
                              psVar26->img_comp[3].dc_pred = 0;
                              psVar26->img_comp[2].dc_pred = 0;
                              psVar26->img_comp[1].dc_pred = 0;
                              psVar26->img_comp[0].dc_pred = 0;
                              psVar26->marker = 0xff;
                              iVar22 = psVar26->restart_interval;
                              uVar41 = 0x7fffffff;
                              if (iVar22 == 0) {
                                iVar22 = 0x7fffffff;
                              }
                              psVar26->todo = iVar22;
                              psVar26->eob_run = 0;
                            }
                            else {
                              local_89b8 = 1;
                              bVar57 = false;
                            }
                          }
                        }
                      }
                      uVar49 = (uint)uVar41;
                      if (!bVar57) {
                        iVar19 = (int)local_89b8;
                        goto LAB_002d3225;
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar19 != iVar21);
                  }
                  uVar49 = (uint)uVar41;
                  iVar19 = 1;
                  local_89dc = local_89dc + 1;
                } while (local_89dc != iVar48);
              }
            }
            else {
              iVar19 = 1;
              if (0 < psVar26->img_mcu_y) {
                iVar52 = 0;
                do {
                  if (0 < psVar26->img_mcu_x) {
                    iVar48 = 0;
                    do {
                      if (0 < psVar26->scan_n) {
                        uVar43 = 0;
                        do {
                          local_89e8 = uVar43;
                          iVar19 = psVar26->order[local_89e8];
                          if (0 < psVar26->img_comp[iVar19].v) {
                            iVar21 = 0;
                            bVar57 = true;
LAB_002d2e59:
                            iVar22 = paVar1[iVar19].h;
                            if (iVar22 < 1) goto LAB_002d2ebc;
                            iVar45 = 0;
                            while( true ) {
                              iVar22 = stbi__jpeg_decode_block_prog_dc
                                                 (psVar26,paVar1[iVar19].coeff +
                                                          (iVar22 * iVar48 + iVar45 +
                                                          (paVar1[iVar19].v * iVar52 + iVar21) *
                                                          paVar1[iVar19].coeff_w) * 0x40,
                                                  (stbi__huffman *)
                                                  ((long)paVar1[iVar19].hd * 0x690 +
                                                  local_8928._0_8_),iVar19);
                              uVar49 = (uint)extraout_RDX_10;
                              uVar41 = extraout_RDX_10;
                              if (iVar22 == 0) break;
                              iVar45 = iVar45 + 1;
                              iVar22 = paVar1[iVar19].h;
                              if (iVar22 <= iVar45) goto LAB_002d2ebc;
                            }
                            if (!bVar57) goto LAB_002d2ed5;
LAB_002d320a:
                            iVar19 = 0;
                            goto LAB_002d3225;
                          }
LAB_002d2ed5:
                          uVar43 = local_89e8 + 1;
                        } while ((long)(local_89e8 + 1) < (long)psVar26->scan_n);
                      }
                      uVar49 = (uint)uVar41;
                      iVar21 = psVar26->todo;
                      psVar26->todo = iVar21 + -1;
                      iVar19 = 1;
                      if (iVar21 < 2) {
                        if (psVar26->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar26);
                          uVar49 = extraout_EDX_01;
                        }
                        if ((psVar26->marker & 0xf8) != 0xd0) goto LAB_002d3225;
                        psVar26->code_buffer = 0;
                        psVar26->code_bits = 0;
                        psVar26->nomore = 0;
                        psVar26->img_comp[3].dc_pred = 0;
                        psVar26->img_comp[2].dc_pred = 0;
                        psVar26->img_comp[1].dc_pred = 0;
                        psVar26->img_comp[0].dc_pred = 0;
                        psVar26->marker = 0xff;
                        iVar19 = psVar26->restart_interval;
                        uVar41 = 0x7fffffff;
                        if (iVar19 == 0) {
                          iVar19 = 0x7fffffff;
                        }
                        psVar26->todo = iVar19;
                        psVar26->eob_run = 0;
                      }
                      iVar48 = iVar48 + 1;
                    } while (iVar48 < psVar26->img_mcu_x);
                  }
                  uVar49 = (uint)uVar41;
                  iVar19 = 1;
                  iVar52 = iVar52 + 1;
                } while (iVar52 < psVar26->img_mcu_y);
              }
            }
LAB_002d3225:
            if (iVar19 != 0) {
              if (psVar26->marker != 0xff) goto LAB_002d3238;
LAB_002d3245:
              do {
                psVar53 = psVar26->s;
                if ((psVar53->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_002d3261:
                  if (psVar53->img_buffer_end <= psVar53->img_buffer) goto LAB_002d3238;
                }
                else {
                  iVar19 = (*(psVar53->io).eof)(psVar53->io_user_data);
                  if (iVar19 != 0) {
                    if (psVar53->read_from_callbacks != 0) goto LAB_002d3261;
                    goto LAB_002d3238;
                  }
                }
                psVar53 = psVar26->s;
                psVar44 = psVar53->img_buffer;
                if (psVar53->img_buffer_end <= psVar44) {
                  if (psVar53->read_from_callbacks == 0) goto LAB_002d3245;
                  stbi__refill_buffer(psVar53);
                  psVar44 = psVar53->img_buffer;
                }
                psVar53->img_buffer = psVar44 + 1;
              } while (*psVar44 != 0xff);
              psVar53 = psVar26->s;
              psVar44 = psVar53->img_buffer;
              if (psVar44 < psVar53->img_buffer_end) {
LAB_002d32d3:
                psVar53->img_buffer = psVar44 + 1;
                sVar15 = *psVar44;
              }
              else {
                if (psVar53->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar53);
                  psVar44 = psVar53->img_buffer;
                  goto LAB_002d32d3;
                }
                sVar15 = '\0';
              }
              psVar26->marker = sVar15;
              goto LAB_002d3238;
            }
            goto LAB_002d3ff0;
          }
          pcVar31 = "bad SOS len";
        }
LAB_002d3fe7:
        uVar49 = (uint)paVar39;
        *(char **)(in_FS_OFFSET + -0x3a8) = pcVar31;
      }
LAB_002d3ff0:
      stbi__free_jpeg_components(psVar26,psVar26->s->img_n,uVar49);
    }
    else {
      *(char **)(in_FS_OFFSET + -0x3a8) = "bad req_comp";
    }
    data_00 = (stbi__context *)0x0;
    goto LAB_002d4005;
  }
  if (psVar35 < psVar8) {
LAB_002d1c84:
    s->img_buffer = psVar35 + 1;
    if (*psVar35 != 'B') goto LAB_002d1dfb;
    psVar35 = s->img_buffer;
    if (s->img_buffer_end <= psVar35) {
      if (s->read_from_callbacks == 0) goto LAB_002d1dfb;
      stbi__refill_buffer(s);
      psVar35 = s->img_buffer;
    }
    s->img_buffer = psVar35 + 1;
    if (*psVar35 != 'M') goto LAB_002d1dfb;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar49 = stbi__get16le(s);
    iVar19 = stbi__get16le(s);
    uVar49 = iVar19 << 0x10 | uVar49;
    if ((((0x38 < uVar49) || ((0x100010000001000U >> ((ulong)uVar49 & 0x3f) & 1) == 0)) &&
        (uVar49 != 0x7c)) && (uVar49 != 0x6c)) goto LAB_002d1dfb;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    uStack_8970._4_4_ = 0xff;
    pvVar28 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8988);
    local_8a10 = uStack_8970._4_4_;
    uVar49 = (uint)uStack_8970;
    if (pvVar28 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar23 = s->img_y;
    uVar51 = -uVar23;
    if (0 < (int)uVar23) {
      uVar51 = uVar23;
    }
    s->img_y = uVar51;
    if ((uVar51 < 0x1000001) && (uVar36 = s->img_x, uVar36 < 0x1000001)) {
      uVar12 = local_8988._0_4_;
      if ((int)uStack_8980 == 0xc) {
        if ((int)local_8988._0_4_ < 0x18) {
          uVar41 = (ulong)(uint)(((local_8988._4_4_ - local_8968) + -0x18) / 3);
        }
        else {
LAB_002d4043:
          uVar41 = 0;
        }
      }
      else {
        if (0xf < (int)local_8988._0_4_) goto LAB_002d4043;
        uVar41 = (ulong)(uint)(local_8988._4_4_ - (local_8968 + (int)uStack_8980) >> 2);
      }
      iVar19 = (int)uVar41;
      if (iVar19 == 0) {
        if (local_8988._4_4_ !=
            ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
          pbrt::LogFatal<char_const(&)[89]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                     ,0x1515,"Check failed: %s",
                     (char (*) [89])
                     "info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                    );
        }
        if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
            (stbi_uc *)(long)(int)local_8988._4_4_) {
          pcVar31 = "bad offset";
          goto LAB_002d45de;
        }
      }
      s->img_n = 4 - (uint)((uint)uStack_8970 == 0 ||
                           local_8988._0_4_ == 0x18 && (uint)uStack_8970 == 0xff000000);
      iVar52 = req_comp;
      if (req_comp < 3) {
        iVar52 = s->img_n;
      }
      iVar48 = stbi__mad3sizes_valid(iVar52,uVar36,uVar51,0);
      if (iVar48 == 0) goto LAB_002d45d7;
      local_8930 = uVar23;
      data_02 = (uchar *)stbi__malloc_mad3(iVar52,uVar36,uVar51,0);
      if (data_02 != (uchar *)0x0) {
        local_8928._0_8_ = data_02;
        local_88e8._0_4_ = iVar52;
        if ((int)uVar12 < 0x10) {
          if (iVar19 < 0x101 && iVar19 != 0) {
            if (0 < iVar19) {
              uVar43 = 0;
              do {
                psVar44 = s->img_buffer;
                if (psVar44 < s->img_buffer_end) {
LAB_002d4264:
                  s->img_buffer = psVar44 + 1;
                  sVar15 = *psVar44;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar44 = s->img_buffer;
                    goto LAB_002d4264;
                  }
                  sVar15 = '\0';
                }
                local_88a8.pal[uVar43 - 0xd][2] = sVar15;
                psVar44 = s->img_buffer;
                if (psVar44 < s->img_buffer_end) {
LAB_002d42a8:
                  s->img_buffer = psVar44 + 1;
                  sVar15 = *psVar44;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar44 = s->img_buffer;
                    goto LAB_002d42a8;
                  }
                  sVar15 = '\0';
                }
                local_88a8.pal[uVar43 - 0xd][1] = sVar15;
                psVar44 = s->img_buffer;
                if (psVar44 < s->img_buffer_end) {
LAB_002d42ec:
                  s->img_buffer = psVar44 + 1;
                  sVar15 = *psVar44;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar44 = s->img_buffer;
                    goto LAB_002d42ec;
                  }
                  sVar15 = '\0';
                }
                local_88a8.pal[uVar43 - 0xd][0] = sVar15;
                if ((int)uStack_8980 != 0xc) {
                  psVar44 = s->img_buffer;
                  if (s->img_buffer_end <= psVar44) {
                    if (s->read_from_callbacks == 0) goto LAB_002d433c;
                    stbi__refill_buffer(s);
                    psVar44 = s->img_buffer;
                  }
                  s->img_buffer = psVar44 + 1;
                }
LAB_002d433c:
                local_88a8.pal[uVar43 - 0xd][3] = 0xff;
                uVar43 = uVar43 + 1;
              } while (uVar41 != uVar43);
            }
            stbi__skip(s,(iVar19 * ((int)uStack_8980 == 0xc | 0xfffffffc) + local_8988._4_4_) -
                         ((int)uStack_8980 + local_8968));
            if (uVar12 == 8) {
              uVar49 = s->img_x;
            }
            else if (uVar12 == 4) {
              uVar49 = s->img_x + 1 >> 1;
            }
            else {
              if (uVar12 != 1) {
                free(data_02);
                pcVar31 = "bad bpp";
                goto LAB_002d45de;
              }
              uVar49 = s->img_x + 7 >> 3;
            }
            local_89d0._0_4_ = -uVar49 & 3;
            if (uVar12 == 1) {
              if (0 < (int)s->img_y) {
                iVar19 = 0;
                iVar48 = 0;
                do {
                  pbVar32 = s->img_buffer;
                  if (pbVar32 < s->img_buffer_end) {
LAB_002d4651:
                    s->img_buffer = pbVar32 + 1;
                    uVar49 = (uint)*pbVar32;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar32 = s->img_buffer;
                      goto LAB_002d4651;
                    }
                    uVar49 = 0;
                  }
                  uVar23 = 7;
                  sVar20 = 1;
                  do {
                    sVar7 = s->img_x;
                    if ((int)sVar7 <= (int)(sVar20 - 1)) break;
                    uVar41 = (ulong)(uVar49 >> (uVar23 & 0x1f) & 1);
                    data_02[iVar19] = local_88a8.pal[uVar41 - 0xd][0];
                    data_02[(long)iVar19 + 1] = local_88a8.pal[uVar41 - 0xd][1];
                    data_02[(long)iVar19 + 2] = local_88a8.pal[uVar41 - 0xd][2];
                    iVar21 = iVar19 + 3;
                    if (iVar52 == 4) {
                      data_02[(long)iVar19 + 3] = 0xff;
                      iVar21 = iVar19 + 4;
                    }
                    iVar19 = iVar21;
                    if (sVar20 != sVar7) {
                      if ((int)uVar23 < 1) {
                        pbVar32 = s->img_buffer;
                        if (pbVar32 < s->img_buffer_end) {
LAB_002d46ff:
                          s->img_buffer = pbVar32 + 1;
                          uVar49 = (uint)*pbVar32;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar32 = s->img_buffer;
                            goto LAB_002d46ff;
                          }
                          uVar49 = 0;
                        }
                        uVar23 = 7;
                        data_02 = (uchar *)local_8928._0_8_;
                      }
                      else {
                        uVar23 = uVar23 - 1;
                      }
                    }
                    bVar57 = sVar20 != sVar7;
                    sVar20 = sVar20 + 1;
                  } while (bVar57);
                  stbi__skip(s,(uint)local_89d0);
                  iVar48 = iVar48 + 1;
                } while (iVar48 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar41 = 0;
              iVar19 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar48 = 0;
                  do {
                    pbVar32 = s->img_buffer;
                    if (pbVar32 < s->img_buffer_end) {
LAB_002d47c3:
                      s->img_buffer = pbVar32 + 1;
                      uVar49 = (uint)*pbVar32;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar32 = s->img_buffer;
                        goto LAB_002d47c3;
                      }
                      uVar49 = 0;
                    }
                    uVar23 = uVar49 >> 4;
                    if (uVar12 != 4) {
                      uVar23 = uVar49;
                    }
                    uVar43 = (ulong)uVar23;
                    uVar49 = uVar49 & 0xf;
                    if (uVar12 != 4) {
                      uVar49 = 0;
                    }
                    lVar27 = (long)(int)uVar41;
                    uVar47 = lVar27 + 3;
                    data_02[lVar27] = local_88a8.pal[uVar43 - 0xd][0];
                    data_02[lVar27 + 1] = local_88a8.pal[uVar43 - 0xd][1];
                    data_02[lVar27 + 2] = local_88a8.pal[uVar43 - 0xd][2];
                    if (iVar52 == 4) {
                      data_02[lVar27 + 3] = 0xff;
                      uVar47 = (ulong)((int)uVar41 + 4);
                    }
                    sVar20 = s->img_x;
                    if (iVar48 + 1U == sVar20) {
LAB_002d48c9:
                      uVar41 = uVar47 & 0xffffffff;
                    }
                    else {
                      if (uVar12 == 8) {
                        pbVar32 = s->img_buffer;
                        if (pbVar32 < s->img_buffer_end) {
LAB_002d4874:
                          s->img_buffer = pbVar32 + 1;
                          uVar49 = (uint)*pbVar32;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar32 = s->img_buffer;
                            goto LAB_002d4874;
                          }
                          uVar49 = 0;
                        }
                        data_02 = (uchar *)local_8928._0_8_;
                      }
                      lVar27 = (long)(int)uVar47;
                      uVar41 = lVar27 + 3;
                      uVar43 = (ulong)uVar49;
                      data_02[lVar27] = local_88a8.pal[uVar43 - 0xd][0];
                      data_02[lVar27 + 1] = local_88a8.pal[uVar43 - 0xd][1];
                      data_02[lVar27 + 2] = local_88a8.pal[uVar43 - 0xd][2];
                      if (iVar52 == 4) {
                        uVar47 = (ulong)((int)uVar47 + 4);
                        data_02[lVar27 + 3] = 0xff;
                        goto LAB_002d48c9;
                      }
                    }
                  } while ((iVar48 + 1U != sVar20) && (iVar48 = iVar48 + 2, iVar48 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,(uint)local_89d0);
                iVar19 = iVar19 + 1;
              } while (iVar19 < (int)s->img_y);
            }
            goto LAB_002d4c1e;
          }
          free(data_02);
          pcVar31 = "invalid";
          goto LAB_002d45de;
        }
        uVar23 = local_8988._4_4_ - ((int)uStack_8980 + local_8968);
        uVar41 = (ulong)uVar23;
        stbi__skip(s,uVar23);
        if (uVar12 == 0x18) {
          iVar19 = -3;
LAB_002d43f8:
          local_892c = iVar19 * s->img_x & 3;
        }
        else {
          local_892c = 0;
          if (uVar12 == 0x10) {
            iVar19 = -2;
            goto LAB_002d43f8;
          }
        }
        if (uVar12 == 0x18) {
          uVar41 = 0;
LAB_002d443f:
          bVar57 = false;
        }
        else {
          uVar46 = (undefined7)(uVar41 >> 8);
          if (uVar12 != 0x20) {
            uVar41 = CONCAT71(uVar46,1);
            goto LAB_002d443f;
          }
          bVar57 = (uStack_8980._4_4_ == 0xff0000 &&
                   ((uint)uStack_8978 == 0xff00 && uStack_8978._4_4_ == 0xff)) &&
                   uVar49 == 0xff000000;
          uVar41 = CONCAT71(uVar46,(uStack_8980._4_4_ != 0xff0000 ||
                                   ((uint)uStack_8978 != 0xff00 || uStack_8978._4_4_ != 0xff)) ||
                                   uVar49 != 0xff000000);
        }
        iVar22 = 0;
        iVar19 = 0;
        iVar48 = 0;
        iVar21 = 0;
        uVar23 = 0;
        uVar51 = 0;
        uVar36 = 0;
        uVar24 = 0;
        local_8940 = CONCAT44(local_8940._4_4_,(int)uVar41);
        if ((char)uVar41 == '\0') {
LAB_002d4945:
          bVar11 = true;
          if (0 < (int)s->img_y) {
            iVar45 = 0;
            iVar52 = 0;
            do {
              if ((char)uVar41 == '\0') {
                if (0 < (int)s->img_x) {
                  iVar25 = 0;
                  do {
                    psVar44 = s->img_buffer;
                    uVar9 = local_8928._0_8_;
                    if (psVar44 < s->img_buffer_end) {
LAB_002d4aaa:
                      s->img_buffer = psVar44 + 1;
                      sVar15 = *psVar44;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar44 = s->img_buffer;
                        goto LAB_002d4aaa;
                      }
                      sVar15 = '\0';
                    }
                    lVar27 = (long)iVar45;
                    *(stbi_uc *)(uVar9 + 2 + lVar27) = sVar15;
                    psVar44 = s->img_buffer;
                    if (psVar44 < s->img_buffer_end) {
LAB_002d4aee:
                      s->img_buffer = psVar44 + 1;
                      sVar15 = *psVar44;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar44 = s->img_buffer;
                        goto LAB_002d4aee;
                      }
                      sVar15 = '\0';
                    }
                    *(stbi_uc *)(uVar9 + 1 + lVar27) = sVar15;
                    psVar44 = s->img_buffer;
                    if (psVar44 < s->img_buffer_end) {
LAB_002d4b2f:
                      s->img_buffer = psVar44 + 1;
                      sVar15 = *psVar44;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar44 = s->img_buffer;
                        goto LAB_002d4b2f;
                      }
                      sVar15 = '\0';
                    }
                    *(stbi_uc *)(uVar9 + lVar27) = sVar15;
                    bVar16 = 0xff;
                    if (bVar57) {
                      pbVar32 = s->img_buffer;
                      if (s->img_buffer_end <= pbVar32) {
                        if (s->read_from_callbacks == 0) {
                          bVar16 = 0;
                          goto LAB_002d4b82;
                        }
                        stbi__refill_buffer(s);
                        pbVar32 = s->img_buffer;
                      }
                      s->img_buffer = pbVar32 + 1;
                      bVar16 = *pbVar32;
                    }
LAB_002d4b82:
                    uVar41 = lVar27 + 3;
                    if (local_88e8._0_4_ == 4) {
                      *(byte *)(uVar9 + uVar41) = bVar16;
                      uVar41 = (ulong)(iVar45 + 4);
                    }
                    local_8a10 = local_8a10 | bVar16;
                    iVar25 = iVar25 + 1;
                    iVar45 = (int)uVar41;
                  } while (iVar25 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                iVar25 = 0;
                do {
                  uVar37 = stbi__get16le(s);
                  if (uVar12 != 0x10) {
                    iVar38 = stbi__get16le(s);
                    uVar37 = uVar37 | iVar38 << 0x10;
                  }
                  iVar38 = stbi__shiftsigned(uVar37 & uStack_8980._4_4_,iVar22,uVar23);
                  lVar27 = (long)iVar45;
                  uVar9 = local_8928._0_8_;
                  *(char *)(local_8928._0_8_ + lVar27) = (char)iVar38;
                  iVar38 = stbi__shiftsigned(uVar37 & (uint)uStack_8978,iVar19,uVar51);
                  *(char *)(uVar9 + 1 + lVar27) = (char)iVar38;
                  iVar38 = stbi__shiftsigned(uVar37 & uStack_8978._4_4_,iVar48,uVar36);
                  *(char *)(uVar9 + 2 + lVar27) = (char)iVar38;
                  if (uVar49 == 0) {
                    uVar37 = 0xff;
                  }
                  else {
                    uVar37 = stbi__shiftsigned(uVar37 & uVar49,iVar21,uVar24);
                  }
                  uVar41 = lVar27 + 3;
                  if (local_88e8._0_4_ == 4) {
                    *(char *)(local_8928._0_8_ + uVar41) = (char)uVar37;
                    uVar41 = (ulong)(iVar45 + 4);
                  }
                  local_8a10 = local_8a10 | uVar37;
                  iVar25 = iVar25 + 1;
                  iVar45 = (int)uVar41;
                } while (iVar25 < (int)s->img_x);
              }
              stbi__skip(s,local_892c);
              iVar52 = iVar52 + 1;
              uVar41 = local_8940 & 0xffffffff;
            } while (iVar52 < (int)s->img_y);
            bVar11 = true;
            data_02 = (uchar *)local_8928._0_8_;
            iVar52 = local_88e8._0_4_;
          }
        }
        else {
          if (uStack_8978._4_4_ != 0 && ((uint)uStack_8978 != 0 && uStack_8980._4_4_ != 0)) {
            iVar22 = stbi__high_bit(uStack_8980._4_4_);
            uVar23 = stbi__bitcount(uStack_8980._4_4_);
            iVar19 = stbi__high_bit((uint)uStack_8978);
            uVar51 = stbi__bitcount((uint)uStack_8978);
            iVar48 = stbi__high_bit(uStack_8978._4_4_);
            uVar36 = stbi__bitcount(uStack_8978._4_4_);
            iVar21 = stbi__high_bit(uVar49);
            uVar24 = stbi__bitcount(uVar49);
            uVar41 = local_8940 & 0xffffffff;
            if ((uVar24 < 9 && uVar36 < 9) && (uVar51 < 9 && uVar23 < 9)) {
              iVar22 = iVar22 + -7;
              iVar19 = iVar19 + -7;
              iVar48 = iVar48 + -7;
              iVar21 = iVar21 + -7;
              goto LAB_002d4945;
            }
          }
          free(data_02);
          *(char **)(in_FS_OFFSET + -0x3a8) = "bad masks";
          bVar11 = false;
        }
        if (!bVar11) {
          return (void *)0x0;
        }
LAB_002d4c1e:
        if (((iVar52 == 4) && (local_8a10 == 0)) &&
           (uVar49 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar49)) {
          auVar58 = vpbroadcastq_avx512f();
          puVar33 = data_02 + uVar49;
          uVar41 = 0;
          auVar59 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
          auVar60 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
          auVar61 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
          auVar62 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
          auVar63 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar64 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
          auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar67 = vpbroadcastq_avx512f();
            auVar68 = vporq_avx512f(auVar67,auVar66);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              *puVar33 = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-4] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-8] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0xc] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0x10] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0x14] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0x18] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0x1c] = 0xff;
            }
            auVar68 = vporq_avx512f(auVar67,auVar65);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0x20] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-0x24] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-0x28] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0x2c] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0x30] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0x34] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0x38] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0x3c] = 0xff;
            }
            auVar68 = vporq_avx512f(auVar67,auVar64);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0x40] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-0x44] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-0x48] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0x4c] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0x50] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0x54] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0x58] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0x5c] = 0xff;
            }
            auVar68 = vporq_avx512f(auVar67,auVar63);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0x60] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-100] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-0x68] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0x6c] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0x70] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0x74] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0x78] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0x7c] = 0xff;
            }
            auVar68 = vporq_avx512f(auVar67,auVar62);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0x80] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-0x84] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-0x88] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0x8c] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0x90] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0x94] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0x98] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0x9c] = 0xff;
            }
            auVar68 = vporq_avx512f(auVar67,auVar61);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0xa0] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-0xa4] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-0xa8] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0xac] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0xb0] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0xb4] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0xb8] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0xbc] = 0xff;
            }
            auVar68 = vporq_avx512f(auVar67,auVar60);
            uVar43 = vpcmpuq_avx512f(auVar68,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0xc0] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-0xc4] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-200] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0xcc] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0xd0] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0xd4] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0xd8] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0xdc] = 0xff;
            }
            auVar67 = vporq_avx512f(auVar67,auVar59);
            uVar43 = vpcmpuq_avx512f(auVar67,auVar58,2);
            if ((uVar43 & 1) != 0) {
              puVar33[-0xe0] = 0xff;
            }
            if ((uVar43 & 2) != 0) {
              puVar33[-0xe4] = 0xff;
            }
            if ((uVar43 & 4) != 0) {
              puVar33[-0xe8] = 0xff;
            }
            if ((uVar43 & 8) != 0) {
              puVar33[-0xec] = 0xff;
            }
            if ((uVar43 & 0x10) != 0) {
              puVar33[-0xf0] = 0xff;
            }
            if ((uVar43 & 0x20) != 0) {
              puVar33[-0xf4] = 0xff;
            }
            if ((uVar43 & 0x40) != 0) {
              puVar33[-0xf8] = 0xff;
            }
            if ((uVar43 & 0x80) != 0) {
              puVar33[-0xfc] = 0xff;
            }
            uVar41 = uVar41 + 0x40;
            puVar33 = puVar33 + -0x100;
          } while (((uVar49 >> 2) + 0x40 & 0x3fffffc0) != uVar41);
        }
        if (0 < (int)local_8930) {
          uVar49 = (int)s->img_y >> 1;
          if (0 < (int)uVar49) {
            uVar51 = s->img_x * local_88e8._0_4_;
            uVar23 = (s->img_y - 1) * uVar51;
            uVar41 = 0;
            uVar43 = 0;
            do {
              if (0 < (int)uVar51) {
                uVar47 = 0;
                do {
                  uVar2 = data_02[uVar47 + uVar41];
                  data_02[uVar47 + uVar41] = data_02[uVar47 + uVar23];
                  data_02[uVar47 + uVar23] = uVar2;
                  uVar47 = uVar47 + 1;
                } while (uVar51 != uVar47);
              }
              uVar43 = uVar43 + 1;
              uVar23 = uVar23 - uVar51;
              uVar41 = (ulong)((int)uVar41 + uVar51);
            } while (uVar43 != uVar49);
          }
        }
        if ((local_88e8._0_4_ != req_comp && req_comp != 0) &&
           (data_02 = stbi__convert_format(data_02,local_88e8._0_4_,req_comp,s->img_x,s->img_y),
           data_02 == (uchar *)0x0)) {
          return (void *)0x0;
        }
        *local_8958 = s->img_x;
        *local_8950 = s->img_y;
        if (local_8948 != (int *)0x0) {
          *local_8948 = s->img_n;
          return data_02;
        }
        return data_02;
      }
LAB_002d57c3:
      pcVar31 = "outofmem";
      goto LAB_002d45de;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar35 = s->img_buffer;
      goto LAB_002d1c84;
    }
LAB_002d1dfb:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar19 = stbi__gif_test(s);
    if (iVar19 != 0) {
      memset(&local_88a8,0,0x8870);
      data_00 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_8948,0,psVar44);
      if (data_00 == s) {
        data_00 = (stbi__context *)0x0;
      }
      if (data_00 == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data_00 = (stbi__context *)0x0;
      }
      else {
        *local_8958 = local_88a8.w;
        *local_8950 = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data_00 = (stbi__context *)
                    stbi__convert_format((uchar *)data_00,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      psVar26 = (stbi__jpeg *)local_88a8.background;
LAB_002d4005:
      free(psVar26);
      return data_00;
    }
    iVar19 = stbi__get16be(s);
    uVar49 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar49 | iVar19 << 0x10) != 0x38425053) {
      iVar19 = stbi__pnm_test(s);
      if (iVar19 != 0) {
        pvVar28 = stbi__pnm_load(s,(int *)local_8958,(int *)local_8950,local_8948,req_comp,ri_00);
        return pvVar28;
      }
      iVar19 = stbi__hdr_test(s);
      piVar55 = local_8948;
      psVar14 = local_8950;
      psVar13 = local_8958;
      if (iVar19 != 0) {
        data_01 = stbi__hdr_load(s,(int *)local_8958,(int *)local_8950,local_8948,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar55;
        }
        psVar44 = stbi__hdr_to_ldr(data_01,*psVar13,*psVar14,req_comp);
        return psVar44;
      }
      iVar19 = stbi__tga_test(s);
      if (iVar19 != 0) {
        pvVar28 = stbi__tga_load(s,(int *)local_8958,(int *)local_8950,piVar55,req_comp,ri_00);
        return pvVar28;
      }
      pcVar31 = "unknown image type";
      goto LAB_002d45de;
    }
    iVar19 = stbi__get16be(s);
    uVar49 = stbi__get16be(s);
    if ((uVar49 | iVar19 << 0x10) != 0x38425053) {
      pcVar31 = "not PSD";
      goto LAB_002d45de;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      pcVar31 = "wrong version";
      goto LAB_002d45de;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_002d34a5:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar19 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar19) goto LAB_002d34a5;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar19);
    }
    uVar49 = stbi__get16be(s);
    if (0x10 < uVar49) {
      pcVar31 = "wrong channel count";
      goto LAB_002d45de;
    }
    iVar19 = stbi__get16be(s);
    iVar19 = iVar19 * 0x10000;
    uVar23 = stbi__get16be(s);
    uVar51 = iVar19 + uVar23;
    iVar52 = stbi__get16be(s);
    iVar48 = stbi__get16be(s);
    if ((int)uVar51 < 0x1000001) {
      iVar52 = iVar52 * 0x10000;
      uVar36 = iVar52 + iVar48;
      if ((int)uVar36 < 0x1000001) {
        iVar21 = stbi__get16be(s);
        if ((iVar21 != 8) && (iVar21 != 0x10)) {
          pcVar31 = "unsupported bit depth";
          goto LAB_002d45de;
        }
        iVar22 = stbi__get16be(s);
        if (iVar22 != 3) {
          pcVar31 = "wrong color format";
          goto LAB_002d45de;
        }
        sVar20 = stbi__get32be(s);
        stbi__skip(s,sVar20);
        sVar20 = stbi__get32be(s);
        stbi__skip(s,sVar20);
        sVar20 = stbi__get32be(s);
        stbi__skip(s,sVar20);
        uVar24 = stbi__get16be(s);
        if (1 < uVar24) {
          pcVar31 = "bad compression";
          goto LAB_002d45de;
        }
        iVar22 = stbi__mad3sizes_valid(4,uVar36,uVar51,0);
        if (iVar22 != 0) {
          if (((local_88e8._0_4_ == 0x10) && (iVar21 == 0x10)) && (uVar24 == 0)) {
            data_03 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar36,uVar51,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            data_03 = (stbi__uint16 *)malloc((long)(int)(uVar51 * uVar36 * 4));
          }
          if (data_03 != (stbi__uint16 *)0x0) {
            iVar22 = uVar36 * uVar51;
            local_8940 = (ulong)uVar23;
            if (uVar24 == 0) {
              bVar57 = local_88e8._0_4_ == 0x10;
              auVar58 = vpbroadcastq_avx512f();
              psVar42 = data_03 + 0x7e;
              uVar41 = CONCAT44(0,(uVar23 + iVar19) * (iVar48 + iVar52));
              psVar56 = data_03 + 0x7c;
              local_88e8._0_8_ = uVar41;
              uVar43 = 0;
              local_8928 = vmovdqu64_avx512f(auVar58);
              local_89f8 = data_03;
              local_89d0 = data_03;
              local_8938 = s;
              do {
                if (uVar43 < uVar49) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar22) {
                      lVar27 = 0;
                      do {
                        iVar45 = stbi__get16be(local_8938);
                        auVar58 = vmovdqu64_avx512f(local_8928);
                        local_89f8[lVar27 * 4] = (stbi__uint16)iVar45;
                        lVar27 = lVar27 + 1;
                      } while (local_88e8._0_4_ != (int)lVar27);
                    }
                  }
                  else if (iVar21 == 0x10) {
                    if (0 < iVar22) {
                      lVar27 = 0;
                      do {
                        iVar45 = stbi__get16be(local_8938);
                        auVar58 = vmovdqu64_avx512f(local_8928);
                        *(char *)(local_89d0 + lVar27 * 2) = (char)((uint)iVar45 >> 8);
                        lVar27 = lVar27 + 1;
                      } while (local_88e8._0_4_ != (int)lVar27);
                    }
                  }
                  else if (0 < iVar22) {
                    lVar27 = 0;
                    do {
                      psVar53 = local_8938;
                      psVar35 = local_8938->img_buffer;
                      if (psVar35 < local_8938->img_buffer_end) {
LAB_002d6038:
                        psVar53->img_buffer = psVar35 + 1;
                        sVar15 = *psVar35;
                      }
                      else {
                        if (local_8938->read_from_callbacks != 0) {
                          stbi__refill_buffer(local_8938);
                          auVar58 = vmovdqu64_avx512f(local_8928);
                          psVar35 = psVar53->img_buffer;
                          goto LAB_002d6038;
                        }
                        sVar15 = '\0';
                      }
                      *(stbi_uc *)(local_89d0 + lVar27 * 2) = sVar15;
                      lVar27 = lVar27 + 1;
                    } while (local_88e8._0_4_ != (int)lVar27);
                  }
                }
                else if (iVar21 == 0x10 && bVar57) {
                  if (0 < iVar22) {
                    sVar18 = -(ushort)(uVar43 == 3);
                    uVar47 = 0;
                    do {
                      auVar59 = vpbroadcastq_avx512f();
                      auVar60 = vporq_avx512f(auVar59,_DAT_0046a440);
                      uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                      if ((uVar10 & 1) != 0) {
                        psVar56[(uVar47 - 0x1f) * 4] = sVar18;
                      }
                      if ((uVar10 & 2) != 0) {
                        psVar56[(uVar47 - 0x1e) * 4] = sVar18;
                      }
                      if ((uVar10 & 4) != 0) {
                        psVar56[(uVar47 - 0x1d) * 4] = sVar18;
                      }
                      if ((uVar10 & 8) != 0) {
                        psVar56[(uVar47 - 0x1c) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x10) != 0) {
                        psVar56[(uVar47 - 0x1b) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x20) != 0) {
                        psVar56[(uVar47 - 0x1a) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x40) != 0) {
                        psVar56[(uVar47 - 0x19) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x80) != 0) {
                        psVar56[(uVar47 - 0x18) * 4] = sVar18;
                      }
                      auVar60 = vporq_avx512f(auVar59,_DAT_0046a400);
                      uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                      if ((uVar10 & 1) != 0) {
                        psVar56[(uVar47 - 0x17) * 4] = sVar18;
                      }
                      if ((uVar10 & 2) != 0) {
                        psVar56[(uVar47 - 0x16) * 4] = sVar18;
                      }
                      if ((uVar10 & 4) != 0) {
                        psVar56[(uVar47 - 0x15) * 4] = sVar18;
                      }
                      if ((uVar10 & 8) != 0) {
                        psVar56[(uVar47 - 0x14) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x10) != 0) {
                        psVar56[(uVar47 - 0x13) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x20) != 0) {
                        psVar56[(uVar47 - 0x12) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x40) != 0) {
                        psVar56[(uVar47 - 0x11) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x80) != 0) {
                        psVar56[(uVar47 - 0x10) * 4] = sVar18;
                      }
                      auVar60 = vporq_avx512f(auVar59,_DAT_0046a3c0);
                      uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                      if ((uVar10 & 1) != 0) {
                        psVar56[(uVar47 - 0xf) * 4] = sVar18;
                      }
                      if ((uVar10 & 2) != 0) {
                        psVar56[(uVar47 - 0xe) * 4] = sVar18;
                      }
                      if ((uVar10 & 4) != 0) {
                        psVar56[(uVar47 - 0xd) * 4] = sVar18;
                      }
                      if ((uVar10 & 8) != 0) {
                        psVar56[(uVar47 - 0xc) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x10) != 0) {
                        psVar56[(uVar47 - 0xb) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x20) != 0) {
                        psVar56[(uVar47 - 10) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x40) != 0) {
                        psVar56[(uVar47 - 9) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x80) != 0) {
                        psVar56[(uVar47 - 8) * 4] = sVar18;
                      }
                      auVar59 = vporq_avx512f(auVar59,_DAT_0046a380);
                      uVar10 = vpcmpuq_avx512f(auVar59,auVar58,2);
                      if ((uVar10 & 1) != 0) {
                        psVar56[(uVar47 - 7) * 4] = sVar18;
                      }
                      if ((uVar10 & 2) != 0) {
                        psVar56[(uVar47 - 6) * 4] = sVar18;
                      }
                      if ((uVar10 & 4) != 0) {
                        psVar56[(uVar47 - 5) * 4] = sVar18;
                      }
                      if ((uVar10 & 8) != 0) {
                        psVar56[(uVar47 - 4) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x10) != 0) {
                        psVar56[(uVar47 - 3) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x20) != 0) {
                        psVar56[(uVar47 - 2) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x40) != 0) {
                        psVar56[(uVar47 - 1) * 4] = sVar18;
                      }
                      if ((uVar10 & 0x80) != 0) {
                        psVar56[uVar47 * 4] = sVar18;
                      }
                      uVar47 = uVar47 + 0x20;
                    } while ((uVar41 + 0x1f & 0xffffffffffffffe0) != uVar47);
                  }
                }
                else if (0 < iVar22) {
                  cVar17 = -(uVar43 == 3);
                  uVar47 = 0;
                  do {
                    auVar59 = vpbroadcastq_avx512f();
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a440);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff82) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff84) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff86) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff88) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff8a) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff8c) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff8e) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff90) = cVar17;
                    }
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a400);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff92) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff94) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff96) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff98) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff9a) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff9c) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffff9e) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffa0) = cVar17;
                    }
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a3c0);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffa2) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffa4) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffa6) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffa8) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffaa) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffac) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffae) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffb0) = cVar17;
                    }
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a380);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffb2) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffb4) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffb6) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffb8) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffba) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffbc) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffbe) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffc0) = cVar17;
                    }
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a340);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffc2) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffc4) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffc6) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffc8) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffca) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffcc) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffce) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffd0) = cVar17;
                    }
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a300);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffd2) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffd4) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffd6) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffd8) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffda) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffdc) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffde) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffe0) = cVar17;
                    }
                    auVar60 = vporq_avx512f(auVar59,_DAT_0046a2c0);
                    uVar10 = vpcmpuq_avx512f(auVar60,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffe2) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffe4) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffe6) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffe8) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffea) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffec) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xffffffffffffffee) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffff0) = cVar17;
                    }
                    auVar59 = vporq_avx512f(auVar59,_DAT_0046a280);
                    uVar10 = vpcmpuq_avx512f(auVar59,auVar58,2);
                    if ((uVar10 & 1) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffff2) = cVar17;
                    }
                    if ((uVar10 & 2) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffff4) = cVar17;
                    }
                    if ((uVar10 & 4) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffff6) = cVar17;
                    }
                    if ((uVar10 & 8) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffff8) = cVar17;
                    }
                    if ((uVar10 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffffa) = cVar17;
                    }
                    if ((uVar10 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffffc) = cVar17;
                    }
                    if ((uVar10 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar47 * 2 + 0xfffffffffffffffe) = cVar17;
                    }
                    if ((uVar10 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar47 * 2) = cVar17;
                    }
                    uVar47 = uVar47 + 0x40;
                  } while ((uVar41 + 0x3f & 0xffffffffffffffc0) != uVar47);
                }
                uVar24 = (uint)psVar44;
                uVar43 = uVar43 + 1;
                psVar42 = (stbi__uint16 *)((long)psVar42 + 1);
                psVar56 = psVar56 + 1;
                local_89d0 = (stbi__uint16 *)((long)local_89d0 + 1);
                local_89f8 = local_89f8 + 1;
              } while (uVar43 != 4);
            }
            else {
              stbi__skip(s,uVar49 * uVar51 * 2);
              auVar66 = vpbroadcastq_avx512f();
              psVar42 = data_03 + 0x7e;
              uVar41 = 0;
              auVar65 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
              auVar64 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
              auVar63 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
              auVar62 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
              auVar61 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
              auVar60 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
              auVar59 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar58 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              local_88e8 = vmovdqu64_avx512f(auVar66);
              do {
                if (uVar41 < uVar49) {
                  iVar21 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_03 + uVar41),iVar22);
                  auVar58 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar59 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar60 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
                  auVar61 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
                  auVar62 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
                  auVar63 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
                  auVar64 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
                  auVar65 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
                  auVar66 = vmovdqu64_avx512f(local_88e8);
                  if (iVar21 == 0) {
                    free(data_03);
                    pcVar31 = "corrupt";
                    goto LAB_002d45de;
                  }
                }
                else if (0 < iVar22) {
                  cVar17 = -(uVar41 == 3);
                  uVar43 = 0;
                  do {
                    auVar67 = vpbroadcastq_avx512f();
                    auVar68 = vporq_avx512f(auVar67,auVar58);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff82) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff84) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff86) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff88) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff8a) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff8c) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff8e) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff90) = cVar17;
                    }
                    auVar68 = vporq_avx512f(auVar67,auVar59);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff92) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff94) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff96) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff98) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff9a) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff9c) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffff9e) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffa0) = cVar17;
                    }
                    auVar68 = vporq_avx512f(auVar67,auVar60);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffa2) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffa4) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffa6) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffa8) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffaa) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffac) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffae) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffb0) = cVar17;
                    }
                    auVar68 = vporq_avx512f(auVar67,auVar61);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffb2) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffb4) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffb6) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffb8) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffba) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffbc) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffbe) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffc0) = cVar17;
                    }
                    auVar68 = vporq_avx512f(auVar67,auVar62);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffc2) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffc4) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffc6) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffc8) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffca) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffcc) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffce) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffd0) = cVar17;
                    }
                    auVar68 = vporq_avx512f(auVar67,auVar63);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffd2) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffd4) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffd6) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffd8) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffda) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffdc) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffde) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffe0) = cVar17;
                    }
                    auVar68 = vporq_avx512f(auVar67,auVar64);
                    uVar47 = vpcmpuq_avx512f(auVar68,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffe2) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffe4) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffe6) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffe8) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffea) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffec) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xffffffffffffffee) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffff0) = cVar17;
                    }
                    auVar67 = vporq_avx512f(auVar67,auVar65);
                    uVar47 = vpcmpuq_avx512f(auVar67,auVar66,2);
                    if ((uVar47 & 1) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffff2) = cVar17;
                    }
                    if ((uVar47 & 2) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffff4) = cVar17;
                    }
                    if ((uVar47 & 4) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffff6) = cVar17;
                    }
                    if ((uVar47 & 8) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffff8) = cVar17;
                    }
                    if ((uVar47 & 0x10) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffffa) = cVar17;
                    }
                    if ((uVar47 & 0x20) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffffc) = cVar17;
                    }
                    if ((uVar47 & 0x40) != 0) {
                      *(char *)(psVar42 + uVar43 * 2 + 0xfffffffffffffffe) = cVar17;
                    }
                    if ((uVar47 & 0x80) != 0) {
                      *(char *)(psVar42 + uVar43 * 2) = cVar17;
                    }
                    uVar43 = uVar43 + 0x40;
                  } while (((ulong)((uVar23 + iVar19) * (iVar48 + iVar52)) + 0x3f &
                           0xffffffffffffffc0) != uVar43);
                }
                uVar24 = (uint)psVar44;
                uVar41 = uVar41 + 1;
                psVar42 = (stbi__uint16 *)((long)psVar42 + 1);
              } while (uVar41 != 4);
            }
            if (3 < uVar49) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar22) {
                  uVar41 = 0;
                  do {
                    uVar4 = data_03[uVar41 * 4 + 3];
                    if ((uVar4 != 0) && (uVar4 != 0xffff)) {
                      fVar69 = 1.0 / ((float)uVar4 / 65535.0);
                      fVar70 = (1.0 - fVar69) * 65535.0;
                      auVar78 = vpmovzxwd_avx(ZEXT416(*(uint *)(data_03 + uVar41 * 4)));
                      auVar78 = vcvtdq2ps_avx(auVar78);
                      auVar76._4_4_ = fVar69;
                      auVar76._0_4_ = fVar69;
                      auVar76._8_4_ = fVar69;
                      auVar76._12_4_ = fVar69;
                      auVar77._4_4_ = fVar70;
                      auVar77._0_4_ = fVar70;
                      auVar77._8_4_ = fVar70;
                      auVar77._12_4_ = fVar70;
                      auVar78 = vfmadd231ps_fma(auVar77,auVar78,auVar76);
                      auVar71._0_4_ = (int)auVar78._0_4_;
                      auVar71._4_4_ = (int)auVar78._4_4_;
                      auVar71._8_4_ = (int)auVar78._8_4_;
                      auVar71._12_4_ = (int)auVar78._12_4_;
                      auVar78 = vpshuflw_avx(auVar71,0xe8);
                      *(int *)(data_03 + uVar41 * 4) = auVar78._0_4_;
                      auVar72._0_4_ = (float)data_03[uVar41 * 4 + 2];
                      auVar72._4_12_ = in_register_000014c4;
                      auVar78 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar69),ZEXT416((uint)fVar70))
                      ;
                      data_03[uVar41 * 4 + 2] = (stbi__uint16)(int)auVar78._0_4_;
                    }
                    uVar41 = uVar41 + 1;
                  } while ((uint)(((int)local_8940 + iVar19) * (iVar48 + iVar52)) != uVar41);
                }
              }
              else if (0 < iVar22) {
                uVar41 = 0;
                do {
                  bVar16 = *(byte *)((long)data_03 + uVar41 * 4 + 3);
                  if ((bVar16 != 0) && (bVar16 != 0xff)) {
                    fVar70 = 1.0 / ((float)bVar16 / 255.0);
                    auVar71 = ZEXT416((uint)fVar70);
                    fVar70 = (1.0 - fVar70) * 255.0;
                    auVar73._0_4_ = (float)(byte)data_03[uVar41 * 2];
                    auVar73._4_12_ = in_register_000014c4;
                    auVar78 = vfmadd213ss_fma(auVar73,auVar71,ZEXT416((uint)fVar70));
                    *(char *)(data_03 + uVar41 * 2) = (char)(int)auVar78._0_4_;
                    auVar74._0_4_ = (float)*(byte *)((long)data_03 + uVar41 * 4 + 1);
                    auVar74._4_12_ = in_register_000014c4;
                    auVar78 = vfmadd213ss_fma(auVar74,auVar71,ZEXT416((uint)fVar70));
                    *(char *)((long)data_03 + uVar41 * 4 + 1) = (char)(int)auVar78._0_4_;
                    auVar75._0_4_ = (float)(byte)data_03[uVar41 * 2 + 1];
                    auVar75._4_12_ = in_register_000014c4;
                    auVar78 = vfmadd213ss_fma(auVar75,auVar71,ZEXT416((uint)fVar70));
                    *(char *)(data_03 + uVar41 * 2 + 1) = (char)(int)auVar78._0_4_;
                  }
                  uVar41 = uVar41 + 1;
                } while ((uint)(((int)local_8940 + iVar19) * (iVar48 + iVar52)) != uVar41);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                data_03 = stbi__convert_format16(data_03,req_comp,uVar36,uVar51,uVar24);
              }
              else {
                data_03 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)data_03,4,req_comp,uVar36,uVar51);
              }
              if (data_03 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (local_8948 != (int *)0x0) {
              *local_8948 = 4;
            }
            *local_8950 = uVar51;
            *local_8958 = uVar36;
            return data_03;
          }
          goto LAB_002d57c3;
        }
      }
    }
  }
LAB_002d45d7:
  pcVar31 = "too large";
LAB_002d45de:
  *(char **)(in_FS_OFFSET + -0x3a8) = pcVar31;
  return (void *)0x0;
LAB_002d2ebc:
  iVar21 = iVar21 + 1;
  bVar57 = iVar21 < paVar1[iVar19].v;
  if (paVar1[iVar19].v <= iVar21) goto LAB_002d2ed5;
  goto LAB_002d2e59;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}